

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O0

void cmakemainProgressCallback(char *m,float prog,void *clientdata)

{
  char *pcVar1;
  ulong uVar2;
  ostream *poVar3;
  string local_78;
  string local_48 [8];
  string dir;
  cmMakefile *mf;
  void *clientdata_local;
  float prog_local;
  char *m_local;
  
  dir.field_2._8_8_ = cmakemainGetMakefile(clientdata);
  std::__cxx11::string::string(local_48);
  if (((dir.field_2._8_8_ == 0) || (pcVar1 = strstr(m,"Configuring"), pcVar1 != m)) || (0.0 <= prog)
     ) {
    if ((dir.field_2._8_8_ != 0) && (pcVar1 = strstr(m,"Generating"), pcVar1 == m)) {
      std::__cxx11::string::operator=(local_48," ");
      pcVar1 = cmMakefile::GetCurrentBinaryDirectory((cmMakefile *)dir.field_2._8_8_);
      std::__cxx11::string::operator+=(local_48,pcVar1);
    }
  }
  else {
    std::__cxx11::string::operator=(local_48," ");
    pcVar1 = cmMakefile::GetCurrentSourceDirectory((cmMakefile *)dir.field_2._8_8_);
    std::__cxx11::string::operator+=(local_48,pcVar1);
  }
  if ((prog < 0.0) || (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    poVar3 = std::operator<<((ostream *)&std::cout,"-- ");
    poVar3 = std::operator<<(poVar3,m);
    poVar3 = std::operator<<(poVar3,local_48);
    cmakemainGetStack_abi_cxx11_(&local_78,clientdata);
    poVar3 = std::operator<<(poVar3,(string *)&local_78);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::ostream::flush();
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

static void cmakemainProgressCallback(const char* m, float prog,
                                      void* clientdata)
{
  cmMakefile* mf = cmakemainGetMakefile(clientdata);
  std::string dir;
  if ((mf) && (strstr(m, "Configuring") == m) && (prog < 0)) {
    dir = " ";
    dir += mf->GetCurrentSourceDirectory();
  } else if ((mf) && (strstr(m, "Generating") == m)) {
    dir = " ";
    dir += mf->GetCurrentBinaryDirectory();
  }

  if ((prog < 0) || (!dir.empty())) {
    std::cout << "-- " << m << dir << cmakemainGetStack(clientdata)
              << std::endl;
  }

  std::cout.flush();
}